

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorFactory.cpp
# Opt level: O0

shared_ptr<ApprovalTests::ApprovalComparator>
ApprovalTests::ComparatorFactory::getComparatorForFile(string *receivedPath)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<ApprovalTests::ApprovalComparator> sVar1;
  string fileExtension;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  
  FileUtils::getExtensionWithDot((string *)local_30);
  getComparatorForFileExtensionWithDot(in_stack_ffffffffffffffd8);
  ::std::__cxx11::string::~string(local_30);
  sVar1.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<ApprovalTests::ApprovalComparator>)
         sVar1.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ApprovalComparator>
    ComparatorFactory::getComparatorForFile(const std::string& receivedPath)
    {
        const std::string fileExtension = FileUtils::getExtensionWithDot(receivedPath);
        return getComparatorForFileExtensionWithDot(fileExtension);
    }